

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

span<const_slang::parsing::Trivia,_18446744073709551615UL> __thiscall
slang::parsing::Token::trivia(Token *this)

{
  byte bVar1;
  Info *pIVar2;
  size_t sVar3;
  pointer pTVar4;
  uint uVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  __extent_storage<18446744073709551615UL> _Var6;
  
  bVar1 = this->field_0x2;
  if ((bVar1 & 0x1e) == 0) {
    pTVar4 = (pointer)0x0;
    _Var6._M_extent_value = 0;
  }
  else {
    pIVar2 = this->info;
    sVar3 = getExtraSize(this->kind);
    pTVar4 = *(pointer *)((long)&pIVar2[1].rawTextPtr + sVar3);
    uVar5 = bVar1 >> 1 & 0xf;
    _Var6._M_extent_value = (size_t)uVar5;
    if (uVar5 == 0xf) {
      _Var6._M_extent_value = *(size_t *)(&pIVar2[1].location.field_0x0 + sVar3);
    }
  }
  sVar7._M_extent._M_extent_value = _Var6._M_extent_value;
  sVar7._M_ptr = pTVar4;
  return sVar7;
}

Assistant:

std::span<Trivia const> Token::trivia() const {
    if (triviaCountSmall == 0)
        return {};

    const Trivia* trivia;
    byte* ptr = info->extra() + getExtraSize(kind);
    memcpy(reinterpret_cast<void*>(&trivia), ptr, sizeof(trivia));

    if (triviaCountSmall == MaxTriviaSmallCount + 1) {
        size_t size;
        memcpy(&size, ptr + sizeof(trivia), sizeof(size_t));
        return {trivia, size};
    }

    return {trivia, triviaCountSmall};
}